

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O2

void __thiscall
spvtools::opt::analysis::DecorationManager::AddMemberDecoration
          (DecorationManager *this,uint32_t inst_id,uint32_t member,uint32_t decoration,
          uint32_t decoration_value)

{
  long lVar1;
  undefined4 uVar2;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  uint32_t local_1b8;
  uint32_t local_1b4;
  uint32_t local_1b0;
  uint32_t local_1ac;
  SmallVector<unsigned_int,_2UL> local_1a8;
  SmallVector<unsigned_int,_2UL> local_180;
  SmallVector<unsigned_int,_2UL> local_158;
  SmallVector<unsigned_int,_2UL> local_130;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined1 local_f0 [48];
  undefined4 local_c0;
  SmallVector<unsigned_int,_2UL> local_b8;
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  SmallVector<unsigned_int,_2UL> local_58;
  
  init_list._M_len = 1;
  init_list._M_array = &local_1ac;
  local_1ac = inst_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_130,init_list);
  local_f0._0_4_ = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_f0 + 8),&local_130);
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_1b0;
  local_1b0 = member;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_158,init_list_00);
  uVar2 = 6;
  local_c0 = uVar2;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b8,&local_158);
  init_list_01._M_len = 1;
  init_list_01._M_array = &local_1b4;
  local_1b4 = decoration;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_180,init_list_01);
  local_90 = uVar2;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,&local_180);
  init_list_02._M_len = 1;
  init_list_02._M_array = &local_1b8;
  local_1b8 = decoration_value;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1a8,init_list_02);
  local_60 = uVar2;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,&local_1a8);
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_108,
             local_f0,&stack0xffffffffffffffd0);
  AddDecoration(this,OpMemberDecorate,
                (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                &local_108);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_108);
  lVar1 = 0x98;
  do {
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_f0 + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x28);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1a8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_180);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_158);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_130);
  return;
}

Assistant:

void DecorationManager::AddMemberDecoration(uint32_t inst_id, uint32_t member,
                                            uint32_t decoration,
                                            uint32_t decoration_value) {
  AddDecoration(
      spv::Op::OpMemberDecorate,
      {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {inst_id}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER, {member}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER, {decoration}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER,
        {decoration_value}}});
}